

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  CType *pCVar1;
  ushort uVar2;
  CType *in_RAX;
  CType *pCVar3;
  CType *local_38;
  
  uVar2 = ct->sib;
  local_38 = in_RAX;
  while( true ) {
    if (uVar2 == 0) {
      return (CType *)0x0;
    }
    pCVar1 = cts->tab + uVar2;
    if ((GCstr *)(pCVar1->name).gcptr64 == name) break;
    if ((pCVar1->info & 0xf0ff0000) == 0x80030000) {
      pCVar3 = lj_ctype_getfieldq(cts,cts->tab + (pCVar1->info & 0xffff),name,ofs,qual);
      if (pCVar3 != (CType *)0x0) {
        if (qual != (CTInfo *)0x0) {
          *qual = *qual;
        }
        *ofs = *ofs + pCVar1->size;
        local_38 = pCVar3;
      }
      if (pCVar3 != (CType *)0x0) {
        return local_38;
      }
    }
    uVar2 = pCVar1->sib;
  }
  *ofs = pCVar1->size;
  return pCVar1;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}